

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

NotificationHandle * __thiscall
jsonrpccxx::GetHandle<std::__cxx11::string_const&>
          (NotificationHandle *__return_storage_ptr__,jsonrpccxx *this,
          _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *f)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (jsonrpccxx *)0x0;
  local_28._8_8_ = 0;
  if (this != (jsonrpccxx *)0x0) {
    pcStack_10 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               ::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)this;
  }
  GetHandle<std::__cxx11::string_const&>
            (__return_storage_ptr__,(jsonrpccxx *)local_28._M_pod_data,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)f);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

NotificationHandle GetHandle(void (*f)(ParamTypes...)) {
    return GetHandle(std::function<void(ParamTypes...)>(f));
  }